

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O1

bool CoreML::Specification::vectorsEqual<CoreML::Specification::DoubleVector>
               (DoubleVector *a,DoubleVector *b)

{
  double dVar1;
  double *pdVar2;
  bool bVar3;
  RepeatedField<double> *this;
  int index;
  
  if ((a->vector_).current_size_ == (b->vector_).current_size_) {
    this = &a->vector_;
    bVar3 = this->current_size_ < 1;
    if (0 < this->current_size_) {
      pdVar2 = google::protobuf::RepeatedField<double>::Get(this,0);
      dVar1 = *pdVar2;
      pdVar2 = google::protobuf::RepeatedField<double>::Get(&b->vector_,0);
      if ((dVar1 == *pdVar2) && (!NAN(dVar1) && !NAN(*pdVar2))) {
        index = 1;
        while (bVar3 = this->current_size_ <= index, index < this->current_size_) {
          pdVar2 = google::protobuf::RepeatedField<double>::Get(this,index);
          dVar1 = *pdVar2;
          pdVar2 = google::protobuf::RepeatedField<double>::Get(&b->vector_,index);
          index = index + 1;
          if (dVar1 != *pdVar2) {
            return bVar3;
          }
          if (NAN(dVar1) || NAN(*pdVar2)) {
            return bVar3;
          }
        }
      }
    }
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool operator==(const NeuralNetworkMeanImage& a,
                        const NeuralNetworkMeanImage& b) {
            if (a.meanimage() != b.meanimage()) {
                return false;
            }
            return true;
        }